

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataCommon.cpp
# Opt level: O2

void DATA_CONVERSION::ConvertSamplesToSpikeTrains
               (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *samples,
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               *spikeTrains,float inputSimulationTime,default_random_engine *generator)

{
  float *pfVar1;
  pointer pvVar2;
  size_type sVar3;
  pointer pvVar4;
  size_type sVar5;
  int activationId_1;
  size_type sVar6;
  int t;
  int iVar7;
  size_type __new_size;
  long lVar8;
  int idx;
  ulong uVar9;
  float fVar10;
  result_type_conflict rVar11;
  param_type local_a8;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  size_type local_88;
  param_type local_80;
  vector<float,_std::allocator<float>_> maxValues;
  vector<float,_std::allocator<float>_> minValues;
  
  pvVar2 = (samples->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pvVar2 != (samples->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    maxValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    local_94 = inputSimulationTime;
    std::vector<float,_std::allocator<float>_>::vector
              (&minValues,
               (long)(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&maxValues,
               (allocator_type *)&local_a8);
    pvVar2 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_a8 = (param_type)((ulong)(uint)local_a8._M_b << 0x20);
    std::vector<float,_std::allocator<float>_>::vector
              (&maxValues,
               (long)*(pointer *)
                      ((long)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data + 8) -
               *(long *)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data >> 2,&local_a8._M_a,(allocator_type *)&local_80);
    pvVar2 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar8 = *(long *)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data;
    __new_size = (long)*(pointer *)
                        ((long)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                super__Vector_impl_data + 8) - lVar8 >> 2;
    for (sVar5 = 0; __new_size != sVar5; sVar5 = sVar5 + 1) {
      fVar10 = *(float *)(lVar8 + sVar5 * 4);
      minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar5] = fVar10;
      *(float *)(CONCAT44(maxValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          maxValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + sVar5 * 4) = fVar10;
    }
    sVar5 = ((long)(samples->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18;
    for (sVar3 = 0; sVar3 != sVar5; sVar3 = sVar3 + 1) {
      for (sVar6 = 0; __new_size != sVar6; sVar6 = sVar6 + 1) {
        lVar8 = *(long *)&pvVar2[sVar3].super__Vector_base<float,_std::allocator<float>_>._M_impl;
        fVar10 = *(float *)(lVar8 + sVar6 * 4);
        if (fVar10 < minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar6]) {
          minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[sVar6] = fVar10;
          fVar10 = *(float *)(lVar8 + sVar6 * 4);
        }
        pfVar1 = (float *)(CONCAT44(maxValues.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    maxValues.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_4_) + sVar6 * 4);
        if (*pfVar1 <= fVar10 && fVar10 != *pfVar1) {
          *(float *)(CONCAT44(maxValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              maxValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + sVar6 * 4) = fVar10;
        }
      }
    }
    local_a8._M_a = 0.0;
    local_a8._M_b = 1.0;
    local_80._M_a = 0.0;
    local_80._M_b = 1e-06;
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::resize(spikeTrains,sVar5);
    lVar8 = 0;
    uVar9 = 0;
    while( true ) {
      pvVar2 = (samples->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = (samples->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pvVar4 - (long)pvVar2) / 0x18) <= uVar9) break;
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *)(*(long *)spikeTrains + lVar8),__new_size);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x18;
    }
    sVar5 = 0;
    while (sVar5 != __new_size) {
      local_9c = *(float *)(CONCAT44(maxValues.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     maxValues.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) + sVar5 * 4) -
                 minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar5];
      local_88 = sVar5;
      for (uVar9 = 0; uVar9 < (ulong)(((long)pvVar4 - (long)pvVar2) / 0x18); uVar9 = uVar9 + 1) {
        local_98 = (*(float *)(*(long *)&pvVar2[uVar9].
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data + local_88 * 4) -
                   minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[local_88]) / local_9c;
        iVar7 = 0;
        while( true ) {
          local_90 = (float)iVar7;
          if (local_94 <= local_90) break;
          rVar11 = std::uniform_real_distribution<float>::operator()
                             ((uniform_real_distribution<float> *)&local_a8,generator);
          if (rVar11 < local_98) {
            lVar8 = *(long *)(*(long *)spikeTrains + uVar9 * 0x18);
            rVar11 = std::uniform_real_distribution<float>::operator()
                               ((uniform_real_distribution<float> *)&local_80,generator);
            local_8c = rVar11 + local_90;
            std::vector<float,_std::allocator<float>_>::emplace_back<float>
                      ((vector<float,_std::allocator<float>_> *)(lVar8 + sVar5 * 0x18),&local_8c);
          }
          iVar7 = iVar7 + 1;
        }
        pvVar2 = (samples->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = (samples->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      sVar5 = local_88 + 1;
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&maxValues.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&minValues.super__Vector_base<float,_std::allocator<float>_>);
  }
  return;
}

Assistant:

void DATA_CONVERSION::ConvertSamplesToSpikeTrains(
        std::vector<SPIKING_NN::Sample> &samples,
        std::vector<SPIKING_NN::SpikeTrain> &spikeTrains,
        float inputSimulationTime,
        std::default_random_engine &generator )
{
    if ( samples.empty()) {
        return;
    }

    std::vector<float> minValues( samples[0].size(), 0 );
    std::vector<float> maxValues( samples[0].size(), 0 );
    for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
        minValues[activationId] = samples[0][activationId];
        maxValues[activationId] = samples[0][activationId];
    }

    for ( auto sampleId = 0; sampleId < samples.size(); ++sampleId ) {
        for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
            if ( samples[sampleId][activationId] < minValues[activationId] ) {
                minValues[activationId] = samples[sampleId][activationId];
            }
            if ( samples[sampleId][activationId] > maxValues[activationId] ) {
                maxValues[activationId] = samples[sampleId][activationId];
            }
        }
    }

    // We are not checking maxValues[idx] == minValues[idx] because such params are redundant in dataset
    std::uniform_real_distribution<float> distribution( 0, 1 );
    std::uniform_real_distribution<float> timeNoiseDistribution( 0, SPIKING_NN::TIME_STEP / 1e4f );
    size_t inputSize = samples[0].size();
    spikeTrains.resize( samples.size());
    for ( int idx = 0; idx < samples.size(); ++idx ) {
        spikeTrains[idx].resize( inputSize );
    }
    for ( auto activationId = 0; activationId < inputSize; ++activationId ) {
        float maxDelta = ( maxValues[activationId] - minValues[activationId] );
        for ( int sid = 0; sid < samples.size(); ++sid ) {
            float &activation = samples[sid][activationId];
            float intensity = ( activation - minValues[activationId] ) / maxDelta;
            for ( int t = 0; t < inputSimulationTime; ++t ) {
                if ( distribution( generator ) < intensity ) {
                    spikeTrains[sid][activationId].emplace_back((float) t + timeNoiseDistribution( generator ));
                }
            }
        }
    }
}